

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChannelController.cpp
# Opt level: O2

Channel __thiscall cali::ChannelController::create(ChannelController *this)

{
  long lVar1;
  ChannelBody *chB;
  int iVar2;
  undefined4 extraout_var;
  _Rb_tree_node_base *p_Var3;
  ostream *poVar4;
  Events *pEVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var6;
  undefined8 *in_RSI;
  Channel CVar7;
  RuntimeConfig cfg;
  Attribute attr;
  Caliper c;
  value_type local_258;
  Log local_238;
  
  lVar1 = *(long *)(in_RSI[1] + 0x90);
  if ((lVar1 == 0) || (*(int *)(lVar1 + 8) < 1)) {
    RuntimeConfig::RuntimeConfig(&cfg);
    RuntimeConfig::allow_read_env(&cfg,SUB81(in_RSI[1],0));
    RuntimeConfig::import
              (&cfg,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)(in_RSI[1] + 0x28));
    Caliper::Caliper(&c);
    Caliper::create_channel((Caliper *)&local_238,(char *)&c,*(RuntimeConfig **)in_RSI[1]);
    std::__shared_ptr<cali::ChannelBody,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<cali::ChannelBody,_(__gnu_cxx::_Lock_policy)2> *)(in_RSI[1] + 0x88),
               (__shared_ptr<cali::ChannelBody,_(__gnu_cxx::_Lock_policy)2> *)&local_238);
    Channel::~Channel((Channel *)&local_238);
    if ((*(long *)(in_RSI[1] + 0x90) == 0) || (*(int *)(*(long *)(in_RSI[1] + 0x90) + 8) < 1)) {
      std::ofstream::ofstream(&local_238);
      local_238.m_level = 0;
      poVar4 = Log::stream(&local_238);
      poVar4 = std::operator<<(poVar4,"ChannelController::create(): Could not create channel ");
      poVar4 = std::operator<<(poVar4,(string *)in_RSI[1]);
      std::endl<char,std::char_traits<char>>(poVar4);
      std::ofstream::~ofstream(&local_238);
      this->_vptr_ChannelController = (_func_int **)0x0;
      (this->mP).
      super___shared_ptr<cali::ChannelController::ChannelControllerImpl,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (element_type *)0x0;
    }
    else {
      (**(code **)*in_RSI)();
      lVar1 = in_RSI[1];
      for (p_Var3 = *(_Rb_tree_node_base **)(lVar1 + 0x70);
          p_Var3 != (_Rb_tree_node_base *)(lVar1 + 0x60);
          p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3)) {
        iVar2 = (*c.super_CaliperMetadataAccessInterface._vptr_CaliperMetadataAccessInterface[4])
                          (&c,p_Var3 + 1,4,0x640,0,0,0);
        attr.m_node = (Node *)CONCAT44(extraout_var,iVar2);
        chB = *(ChannelBody **)(lVar1 + 0x88);
        local_238._0_16_ = cali_make_variant_from_string(*(char **)(p_Var3 + 2));
        Caliper::set(&c,chB,&attr,(Variant *)&local_238);
      }
      pEVar5 = Channel::events((Channel *)(in_RSI[1] + 0x88));
      local_258.super__Function_base._M_functor._8_8_ = 0;
      local_258._M_invoker =
           std::
           _Function_handler<void_(cali::Caliper_*,_cali::Channel_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]Caliper/src/caliper/ChannelController.cpp:102:45)>
           ::_M_invoke;
      local_258.super__Function_base._M_manager =
           std::
           _Function_handler<void_(cali::Caliper_*,_cali::Channel_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]Caliper/src/caliper/ChannelController.cpp:102:45)>
           ::_M_manager;
      std::
      vector<std::function<void_(cali::Caliper_*,_cali::Channel_*)>,_std::allocator<std::function<void_(cali::Caliper_*,_cali::Channel_*)>_>_>
      ::push_back(&(pEVar5->finish_evt).mCb,&local_258);
      std::_Function_base::~_Function_base(&local_258.super__Function_base);
      std::__shared_ptr<cali::ChannelBody,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<cali::ChannelBody,_(__gnu_cxx::_Lock_policy)2> *)this,
                 (__shared_ptr<cali::ChannelBody,_(__gnu_cxx::_Lock_policy)2> *)(in_RSI[1] + 0x88));
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&cfg.mP.
                super___shared_ptr<cali::RuntimeConfig::RuntimeConfigImpl,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    _Var6._M_pi = extraout_RDX_00;
  }
  else {
    std::__shared_ptr<cali::ChannelBody,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<cali::ChannelBody,_(__gnu_cxx::_Lock_policy)2> *)this,
               (__shared_ptr<cali::ChannelBody,_(__gnu_cxx::_Lock_policy)2> *)(in_RSI[1] + 0x88));
    _Var6._M_pi = extraout_RDX;
  }
  CVar7.mP.super___shared_ptr<cali::ChannelBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var6._M_pi;
  CVar7.mP.super___shared_ptr<cali::ChannelBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (Channel)CVar7.mP.super___shared_ptr<cali::ChannelBody,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Channel ChannelController::create()
{
    if (mP->channel)
        return mP->channel;

    RuntimeConfig cfg;

    cfg.allow_read_env(mP->flags & CALI_CHANNEL_ALLOW_READ_ENV);
    cfg.import(mP->config);

    Caliper c;

    mP->channel = c.create_channel(mP->name.c_str(), cfg);

    if (!mP->channel) {
        Log(0).stream() << "ChannelController::create(): Could not create channel " << mP->name << std::endl;
        return Channel();
    }

    on_create(&c, mP->channel);
    add_channel_metadata(c, mP->channel, mP->metadata);

    //   Reset the object's channel pointer if the channel is destroyed
    // behind our back (e.g., in Caliper::release())
    mP->channel.events().finish_evt.connect([this](Caliper*, Channel*) { mP->channel = Channel(); });

    return mP->channel;
}